

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_flush_tests.cpp
# Opt level: O3

void __thiscall
validation_flush_tests::getcoinscachesizestate::test_method(getcoinscachesizestate *this)

{
  FastRandomContext *rng;
  long lVar1;
  CoinsCacheSizeState CVar2;
  float fVar3;
  Chainstate *this_00;
  CCoinsViewCache *this_01;
  size_t sVar4;
  unit_test_log_t *puVar5;
  Coin *pCVar6;
  ulong uVar7;
  iterator in_R8;
  iterator pvVar8;
  iterator in_R9;
  iterator pvVar9;
  int iVar10;
  long in_FS_OFFSET;
  bool bVar11;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  Span<std::byte> output;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  check_type cVar12;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  undefined1 local_214 [4];
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined8 local_170;
  begin local_168;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  uint COIN_SIZE;
  float usage_percentage;
  undefined4 uStack_ec;
  begin local_e8;
  float *local_d0;
  unit_test_log_t local_c8;
  char *local_c0;
  assertion_result local_b8;
  undefined8 *local_a0;
  begin local_98;
  assertion_result *local_80;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock11;
  COutPoint res;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = ChainstateManager::ActiveChainstate
                      ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
                       super_BasicTestingSetup.m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  criticalblock11.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock11.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock11.super_unique_lock);
  this_01 = Chainstate::CoinsTip(this_00);
  COIN_SIZE = 0x50;
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
  ;
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x2c;
  file.m_begin = (iterator)&local_108;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_118,msg);
  CVar2 = Chainstate::GetCoinsCacheSizeState(this_00,0x40200,0);
  local_168.m_file_name.m_begin = (iterator)CONCAT44(2,CVar2);
  _cVar12 = 0x776bff;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<CoinsCacheSizeState>,_CoinsCacheSizeState,_boost::test_tools::assertion::op::NE<CoinsCacheSizeState,_CoinsCacheSizeState,_void>_>
  ::evaluate((assertion_result *)&local_98,
             (binary_expr<boost::test_tools::assertion::value_expr<CoinsCacheSizeState>,_CoinsCacheSizeState,_boost::test_tools::assertion::op::NE<CoinsCacheSizeState,_CoinsCacheSizeState,_void>_>
              *)&local_168,false);
  res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_e8;
  local_e8.m_file_name.m_begin =
       "chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, 0) != CoinsCacheSizeState::CRITICAL"
  ;
  local_e8.m_file_name.m_end = "";
  res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
  res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
  ;
  local_120 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0xe;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_98,(lazy_ostream *)&res,1,0xe,WARN,_cVar12,
             (size_t)&local_128,0x2c);
  boost::detail::shared_count::~shared_count((shared_count *)&local_98.m_line_num);
  sVar4 = CCoinsViewCache::DynamicMemoryUsage(this_01);
  if ((sVar4 == 0x20) || (sVar4 = CCoinsViewCache::DynamicMemoryUsage(this_01), sVar4 == 0x10)) {
    local_e8.m_file_name.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_e8.m_file_name.m_end = "";
    local_e8.m_line_num = 0x24;
    puVar5 = boost::unit_test::unit_test_log_t::operator<<
                       (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8);
    boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)&local_b8,(log_level)puVar5);
    local_98.m_file_name.m_end = (iterator)((ulong)local_98.m_file_name.m_end & 0xffffffffffffff00);
    local_98.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_01389c38;
    local_98.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
    local_80 = (assertion_result *)0xf5722c;
    local_168.m_file_name.m_begin = (iterator)CCoinsViewCache::DynamicMemoryUsage(this_01);
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0138ec30;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ = &local_98;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_168;
    boost::unit_test::ut_detail::entry_value_collector::operator<<
              ((entry_value_collector *)&local_b8,(lazy_ostream *)&res);
    boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
              ((entry_value_collector *)&local_b8);
    local_1a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_198 = "";
    local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x42;
    file_00.m_begin = (iterator)&local_1a0;
    msg_00.m_end = pvVar9;
    msg_00.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1b0,
               msg_00);
    local_e8.m_file_name.m_end = (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
    local_e8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_01388f08;
    local_e8.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
    local_d0 = (float *)0xf4aea1;
    _usage_percentage = (uint *)CCoinsViewCache::DynamicMemoryUsage(this_01);
    local_c8.super_test_observer._vptr_test_observer = (test_observer)&usage_percentage;
    local_a0 = &local_170;
    local_170._0_4_ = 0x20;
    local_168.m_file_name.m_end = (iterator)0x0;
    local_168.m_line_num = 0;
    local_b8._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_b8.m_message.px = (element_type *)0xf56fae;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01388f48;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    local_80 = (assertion_result *)&local_a0;
    local_98.m_file_name.m_end = (iterator)((ulong)local_98.m_file_name.m_end & 0xffffffffffffff00);
    local_98.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_01388f88;
    local_98.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x2;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_c8;
    local_168.m_file_name.m_begin._0_1_ = _usage_percentage == (uint *)0x20;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_168,(lazy_ostream *)&local_e8,1,2,REQUIRE,0xf570cb,
               (size_t)&local_b8,0x42,&res,"is_64_bit ? 32U : 16U",&local_98);
    boost::detail::shared_count::~shared_count((shared_count *)&local_168.m_line_num);
    local_1c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_1b8 = "";
    local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x4d;
    file_01.m_begin = (iterator)&local_1c0;
    msg_01.m_end = pvVar9;
    msg_01.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1d0,
               msg_01);
    local_e8.m_file_name.m_end = (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
    local_e8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_01388f08;
    local_e8.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
    local_d0 = (float *)0xf4aea1;
    CVar2 = Chainstate::GetCoinsCacheSizeState(this_00,0x40200,0);
    _usage_percentage = (uint *)CONCAT44(uStack_ec,CVar2);
    local_170 = (ulong)local_170._4_4_ << 0x20;
    local_168.m_file_name.m_begin =
         (iterator)CONCAT71(local_168.m_file_name.m_begin._1_7_,CVar2 == OK);
    local_168.m_file_name.m_end = (iterator)0x0;
    local_168.m_line_num = 0;
    local_b8._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_b8.m_message.px = (element_type *)0xf56fae;
    local_c8.super_test_observer._vptr_test_observer = (test_observer)&usage_percentage;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0138ec70;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    local_a0 = &local_170;
    local_98.m_file_name.m_end = (iterator)((ulong)local_98.m_file_name.m_end & 0xffffffffffffff00);
    local_98.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_0138ec70;
    local_98.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
    local_80 = (assertion_result *)&local_a0;
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x2;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_c8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_168,(lazy_ostream *)&local_e8,1,2,REQUIRE,0xf57057,
               (size_t)&local_b8,0x4d,&res,"CoinsCacheSizeState::OK",&local_98);
    boost::detail::shared_count::~shared_count((shared_count *)&local_168.m_line_num);
    rng = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
           super_BasicTestingSetup.m_rng;
    iVar10 = 3;
    do {
      AddTestCoin(&res,rng,this_01);
      local_168.m_file_name.m_begin =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
      ;
      local_168.m_file_name.m_end = "";
      local_168.m_line_num = 0x24;
      puVar5 = boost::unit_test::unit_test_log_t::operator<<
                         (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_168);
      boost::unit_test::unit_test_log_t::operator()(&local_c8,(log_level)puVar5);
      local_e8.m_file_name.m_end =
           (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
      local_e8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_01389c38;
      local_e8.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
      local_d0 = (float *)0xf5722c;
      local_b8._0_8_ = CCoinsViewCache::DynamicMemoryUsage(this_01);
      local_98.m_file_name.m_end =
           (iterator)((ulong)local_98.m_file_name.m_end & 0xffffffffffffff00);
      local_98.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_0138ec30;
      local_98.m_line_num = (size_t)&local_e8;
      local_80 = &local_b8;
      boost::unit_test::ut_detail::entry_value_collector::operator<<
                ((entry_value_collector *)&local_c8,(lazy_ostream *)&local_98);
      boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
                ((entry_value_collector *)&local_c8);
      local_1e0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
      ;
      local_1d8 = "";
      local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0x52;
      file_02.m_begin = (iterator)&local_1e0;
      msg_02.m_end = pvVar9;
      msg_02.m_begin = pvVar8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1f0,
                 msg_02);
      local_168.m_file_name.m_end =
           (iterator)((ulong)local_168.m_file_name.m_end & 0xffffffffffffff00);
      local_168.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_01388f08;
      local_168.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
      local_150 = "";
      pCVar6 = CCoinsViewCache::AccessCoin(this_01,&res);
      uVar7 = (ulong)(pCVar6->out).scriptPubKey.super_CScriptBase._union.indirect_contents.capacity;
      if ((pCVar6->out).scriptPubKey.super_CScriptBase._size < 0x1d) {
        uVar7 = 0;
      }
      if ((int)uVar7 == 0) {
        local_170 = 0;
      }
      else {
        local_170 = uVar7 + 0x1f & 0x1fffffff0;
      }
      local_b8.m_message.px = (element_type *)0x0;
      local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_c8.super_test_observer._vptr_test_observer = (test_observer)(_func_int **)0xf56f3f;
      local_c0 = "";
      local_a0 = &local_170;
      local_98.m_file_name.m_end =
           (iterator)((ulong)local_98.m_file_name.m_end & 0xffffffffffffff00);
      local_98.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_01388f48;
      local_98.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
      local_80 = (assertion_result *)&local_a0;
      _usage_percentage = &COIN_SIZE;
      local_e8.m_file_name.m_end =
           (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
      local_e8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_01388f88;
      local_e8.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
      local_d0 = &usage_percentage;
      pvVar8 = (iterator)0x1;
      pvVar9 = (iterator)0x2;
      local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)(local_170 == COIN_SIZE);
      boost::test_tools::tt_detail::report_assertion
                (&local_b8,(lazy_ostream *)&local_168,1,2,REQUIRE,0xf57023,(size_t)&local_c8,0x52,
                 &local_98,"COIN_SIZE",&local_e8);
      boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
      local_200 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
      ;
      local_1f8 = "";
      local_210 = &boost::unit_test::basic_cstring<char_const>::null;
      local_208 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = &DAT_00000058;
      file_03.m_begin = (iterator)&local_200;
      msg_03.m_end = pvVar9;
      msg_03.m_begin = pvVar8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_210,
                 msg_03);
      local_168.m_file_name.m_end =
           (iterator)((ulong)local_168.m_file_name.m_end & 0xffffffffffffff00);
      local_168.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_01388f08;
      local_168.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
      local_150 = "";
      CVar2 = Chainstate::GetCoinsCacheSizeState(this_00,0x40200,0);
      local_170 = CONCAT44(local_170._4_4_,CVar2);
      local_214 = (undefined1  [4])0x1;
      local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)(CVar2 == LARGE);
      local_b8.m_message.px = (element_type *)0x0;
      local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_c8.super_test_observer._vptr_test_observer = (test_observer)(_func_int **)0xf56f3f;
      local_c0 = "";
      local_a0 = &local_170;
      local_98.m_file_name.m_end =
           (iterator)((ulong)local_98.m_file_name.m_end & 0xffffffffffffff00);
      local_98.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_0138ec70;
      local_98.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
      local_80 = (assertion_result *)&local_a0;
      _usage_percentage = (uint *)local_214;
      local_e8.m_file_name.m_end =
           (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
      local_e8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_0138ec70;
      local_e8.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
      local_d0 = &usage_percentage;
      pvVar8 = (iterator)0x1;
      pvVar9 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                (&local_b8,(lazy_ostream *)&local_168,1,2,REQUIRE,0xf57057,(size_t)&local_c8,0x58,
                 &local_98,"CoinsCacheSizeState::LARGE",&local_e8);
      boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
    iVar10 = 3;
    do {
      AddTestCoin(&res,rng,this_01);
      local_e8.m_file_name.m_begin =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
      ;
      local_e8.m_file_name.m_end = "";
      local_e8.m_line_num = 0x24;
      puVar5 = boost::unit_test::unit_test_log_t::operator<<
                         (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8);
      boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)&local_b8,(log_level)puVar5);
      local_98.m_file_name.m_end =
           (iterator)((ulong)local_98.m_file_name.m_end & 0xffffffffffffff00);
      local_98.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_01389c38;
      local_98.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
      local_80 = (assertion_result *)0xf5722c;
      local_168.m_file_name.m_begin = (iterator)CCoinsViewCache::DynamicMemoryUsage(this_01);
      res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
           res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
      res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0138ec30;
      res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ = &local_98;
      res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_168;
      boost::unit_test::ut_detail::entry_value_collector::operator<<
                ((entry_value_collector *)&local_b8,(lazy_ostream *)&res);
      boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
                ((entry_value_collector *)&local_b8);
      CVar2 = Chainstate::GetCoinsCacheSizeState(this_00,0x40200,0);
      bVar11 = iVar10 != 0;
      iVar10 = iVar10 + -1;
      if (CVar2 == CRITICAL) break;
    } while (bVar11);
    local_228 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_220 = "";
    local_238 = &boost::unit_test::basic_cstring<char_const>::null;
    local_230 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0x67;
    file_04.m_begin = (iterator)&local_228;
    msg_04.m_end = pvVar9;
    msg_04.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_238,
               msg_04);
    local_e8.m_file_name.m_end = (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
    local_e8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_01388f08;
    local_e8.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
    local_d0 = (float *)0xf4aea1;
    fVar3 = (float)Chainstate::GetCoinsCacheSizeState(this_00,0x40200,0);
    local_170._0_4_ = 2;
    local_168.m_file_name.m_end = (iterator)0x0;
    local_168.m_line_num = 0;
    local_b8._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_b8.m_message.px = (element_type *)0xf56fae;
    local_c8.super_test_observer._vptr_test_observer = (test_observer)&usage_percentage;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0138ec70;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_c8;
    local_a0 = &local_170;
    local_98.m_file_name.m_end = (iterator)((ulong)local_98.m_file_name.m_end & 0xffffffffffffff00);
    local_98.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_0138ec70;
    local_98.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
    local_80 = (assertion_result *)&local_a0;
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x2;
    usage_percentage = fVar3;
    local_168.m_file_name.m_begin._0_1_ = fVar3 == 2.8026e-45;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_168,(lazy_ostream *)&local_e8,1,2,REQUIRE,0xf57057,
               (size_t)&local_b8,0x67,&res,"CoinsCacheSizeState::CRITICAL",&local_98);
    boost::detail::shared_count::~shared_count((shared_count *)&local_168.m_line_num);
    local_248 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_240 = "";
    local_258 = &boost::unit_test::basic_cstring<char_const>::null;
    local_250 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0x6c;
    file_05.m_begin = (iterator)&local_248;
    msg_05.m_end = pvVar9;
    msg_05.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_258,
               msg_05);
    local_e8.m_file_name.m_end = (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
    local_e8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_01388f08;
    local_e8.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
    local_d0 = (float *)0xf4aea1;
    usage_percentage = (float)Chainstate::GetCoinsCacheSizeState(this_00,0x40200,0x80000);
    local_170 = (ulong)local_170._4_4_ << 0x20;
    local_168.m_file_name.m_begin =
         (iterator)CONCAT71(local_168.m_file_name.m_begin._1_7_,usage_percentage == 0.0);
    local_168.m_file_name.m_end = (iterator)0x0;
    local_168.m_line_num = 0;
    local_b8._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_b8.m_message.px = (element_type *)0xf56fae;
    local_c8.super_test_observer._vptr_test_observer = (test_observer)&usage_percentage;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0138ec70;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_c8;
    local_a0 = &local_170;
    local_98.m_file_name.m_end = (iterator)((ulong)local_98.m_file_name.m_end & 0xffffffffffffff00);
    local_98.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_0138ec70;
    local_98.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
    local_80 = (assertion_result *)&local_a0;
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_168,(lazy_ostream *)&local_e8,1,2,REQUIRE,0xf5712e,
               (size_t)&local_b8,0x6c,&res,"CoinsCacheSizeState::OK",&local_98);
    boost::detail::shared_count::~shared_count((shared_count *)&local_168.m_line_num);
    iVar10 = 3;
    do {
      AddTestCoin(&res,rng,this_01);
      local_e8.m_file_name.m_begin =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
      ;
      local_e8.m_file_name.m_end = "";
      local_e8.m_line_num = 0x24;
      puVar5 = boost::unit_test::unit_test_log_t::operator<<
                         (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8);
      boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)&local_b8,(log_level)puVar5);
      local_98.m_file_name.m_end =
           (iterator)((ulong)local_98.m_file_name.m_end & 0xffffffffffffff00);
      local_98.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_01389c38;
      local_98.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
      local_80 = (assertion_result *)0xf5722c;
      local_168.m_file_name.m_begin = (iterator)CCoinsViewCache::DynamicMemoryUsage(this_01);
      res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
           res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
      res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0138ec30;
      res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ = &local_98;
      res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_168;
      boost::unit_test::ut_detail::entry_value_collector::operator<<
                ((entry_value_collector *)&local_b8,(lazy_ostream *)&res);
      boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
                ((entry_value_collector *)&local_b8);
      local_268 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
      ;
      local_260 = "";
      local_278 = &boost::unit_test::basic_cstring<char_const>::null;
      local_270 = &boost::unit_test::basic_cstring<char_const>::null;
      file_06.m_end = (iterator)0x73;
      file_06.m_begin = (iterator)&local_268;
      msg_06.m_end = pvVar9;
      msg_06.m_begin = pvVar8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_278,
                 msg_06);
      local_e8.m_file_name.m_end =
           (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
      local_e8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_01388f08;
      local_e8.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
      local_d0 = (float *)0xf4aea1;
      usage_percentage = (float)Chainstate::GetCoinsCacheSizeState(this_00,0x40200,0x80000);
      local_170 = local_170 & 0xffffffff00000000;
      local_168.m_file_name.m_begin =
           (iterator)CONCAT71(local_168.m_file_name.m_begin._1_7_,usage_percentage == 0.0);
      local_168.m_file_name.m_end = (iterator)0x0;
      local_168.m_line_num = 0;
      local_b8._0_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
      ;
      local_b8.m_message.px = (element_type *)0xf56fae;
      local_c8.super_test_observer._vptr_test_observer = (test_observer)&usage_percentage;
      res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
           res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
      res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0138ec70;
      res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
           boost::unit_test::lazy_ostream::inst;
      res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_c8;
      local_a0 = &local_170;
      local_98.m_file_name.m_end =
           (iterator)((ulong)local_98.m_file_name.m_end & 0xffffffffffffff00);
      local_98.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_0138ec70;
      local_98.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
      local_80 = (assertion_result *)&local_a0;
      pvVar8 = (iterator)0x1;
      pvVar9 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_168,(lazy_ostream *)&local_e8,1,2,REQUIRE,0xf5712e,
                 (size_t)&local_b8,0x73,&res,"CoinsCacheSizeState::OK",&local_98);
      boost::detail::shared_count::~shared_count((shared_count *)&local_168.m_line_num);
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
    AddTestCoin(&res,rng,this_01);
    local_e8.m_file_name.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_e8.m_file_name.m_end = "";
    local_e8.m_line_num = 0x24;
    puVar5 = boost::unit_test::unit_test_log_t::operator<<
                       (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8);
    boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)&local_b8,(log_level)puVar5);
    local_98.m_file_name.m_end = (iterator)((ulong)local_98.m_file_name.m_end & 0xffffffffffffff00);
    local_98.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_01389c38;
    local_98.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
    local_80 = (assertion_result *)0xf5722c;
    local_168.m_file_name.m_begin = (iterator)CCoinsViewCache::DynamicMemoryUsage(this_01);
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0138ec30;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ = &local_98;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_168;
    boost::unit_test::ut_detail::entry_value_collector::operator<<
              ((entry_value_collector *)&local_b8,(lazy_ostream *)&res);
    boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
              ((entry_value_collector *)&local_b8);
    sVar4 = CCoinsViewCache::DynamicMemoryUsage(this_01);
    usage_percentage = (float)sVar4 / 263680.0;
    local_e8.m_file_name.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_e8.m_file_name.m_end = "";
    local_e8.m_line_num = 0x7e;
    puVar5 = boost::unit_test::unit_test_log_t::operator<<
                       (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8);
    boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)&local_168,(log_level)puVar5);
    local_98.m_file_name.m_end = (iterator)((ulong)local_98.m_file_name.m_end & 0xffffffffffffff00);
    local_98.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_0138ecf0;
    local_98.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
    local_80 = (assertion_result *)0xf57170;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0138ed30;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ = &local_98;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &usage_percentage;
    boost::unit_test::ut_detail::entry_value_collector::operator<<
              ((entry_value_collector *)&local_168,(lazy_ostream *)&res);
    boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
              ((entry_value_collector *)&local_168);
    local_288 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_280 = "";
    local_298 = &boost::unit_test::basic_cstring<char_const>::null;
    local_290 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar12 = 0x777e6b;
    file_07.m_end = (iterator)0x7f;
    file_07.m_begin = (iterator)&local_288;
    msg_07.m_end = pvVar9;
    msg_07.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_298,
               msg_07);
    local_98.m_file_name.m_end = (iterator)0x0;
    local_98.m_line_num = 0;
    local_e8.m_file_name.m_begin = "usage_percentage >= 0.9";
    local_e8.m_file_name.m_end = "";
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    local_2a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_2a0 = "";
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x0;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_e8;
    local_98.m_file_name.m_begin._0_1_ = 0.9 <= usage_percentage;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_98,(lazy_ostream *)&res,1,0,WARN,_cVar12,
               (size_t)&local_2a8,0x7f);
    boost::detail::shared_count::~shared_count((shared_count *)&local_98.m_line_num);
    local_2b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_2b0 = "";
    local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar12 = 0x777f4c;
    file_08.m_end = (iterator)0x80;
    file_08.m_begin = (iterator)&local_2b8;
    msg_08.m_end = pvVar9;
    msg_08.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2c8,
               msg_08);
    local_98.m_file_name.m_begin =
         (iterator)CONCAT71(local_98.m_file_name.m_begin._1_7_,usage_percentage < 1.0);
    local_98.m_file_name.m_end = (iterator)0x0;
    local_98.m_line_num = 0;
    local_e8.m_file_name.m_begin = "usage_percentage < 1";
    local_e8.m_file_name.m_end = "";
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    local_2d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_2d0 = "";
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x0;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_e8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_98,(lazy_ostream *)&res,1,0,WARN,_cVar12,
               (size_t)&local_2d8,0x80);
    boost::detail::shared_count::~shared_count((shared_count *)&local_98.m_line_num);
    local_2e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_2e0 = "";
    local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_09.m_end = (iterator)0x83;
    file_09.m_begin = (iterator)&local_2e8;
    msg_09.m_end = pvVar9;
    msg_09.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_2f8,
               msg_09);
    local_e8.m_file_name.m_end = (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
    local_e8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_01388f08;
    local_e8.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
    local_d0 = (float *)0xf4aea1;
    CVar2 = Chainstate::GetCoinsCacheSizeState(this_00,0x40200,0x400);
    local_170 = CONCAT44(local_170._4_4_,CVar2);
    local_214 = (undefined1  [4])0x1;
    local_168.m_file_name.m_end = (iterator)0x0;
    local_168.m_line_num = 0;
    local_b8._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_b8.m_message.px = (element_type *)0xf56fae;
    local_c8.super_test_observer._vptr_test_observer = (test_observer)&local_170;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0138ec70;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    local_a0 = (undefined8 *)local_214;
    local_98.m_file_name.m_end = (iterator)((ulong)local_98.m_file_name.m_end & 0xffffffffffffff00);
    local_98.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_0138ec70;
    local_98.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
    local_80 = (assertion_result *)&local_a0;
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x2;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_c8;
    local_168.m_file_name.m_begin._0_1_ = CVar2 == LARGE;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_168,(lazy_ostream *)&local_e8,1,2,REQUIRE,0xf571b9,
               (size_t)&local_b8,0x83,&res,"CoinsCacheSizeState::LARGE",&local_98);
    boost::detail::shared_count::~shared_count((shared_count *)&local_168.m_line_num);
    iVar10 = 1000;
    do {
      AddTestCoin(&res,rng,this_01);
      local_308 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
      ;
      local_300 = "";
      local_318 = &boost::unit_test::basic_cstring<char_const>::null;
      local_310 = &boost::unit_test::basic_cstring<char_const>::null;
      file_10.m_end = (iterator)0x8b;
      file_10.m_begin = (iterator)&local_308;
      msg_10.m_end = pvVar9;
      msg_10.m_begin = pvVar8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_318,
                 msg_10);
      local_e8.m_file_name.m_end =
           (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
      local_e8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_01388f08;
      local_e8.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
      local_d0 = (float *)0xf4aea1;
      usage_percentage = (float)Chainstate::GetCoinsCacheSizeState(this_00);
      local_170 = local_170 & 0xffffffff00000000;
      local_168.m_file_name.m_begin._0_1_ = usage_percentage == 0.0;
      local_168.m_file_name.m_end = (iterator)0x0;
      local_168.m_line_num = 0;
      local_b8._0_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
      ;
      local_b8.m_message.px = (element_type *)0xf56fae;
      local_c8.super_test_observer._vptr_test_observer = (test_observer)&usage_percentage;
      res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
           res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
      res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0138ec70;
      res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
           boost::unit_test::lazy_ostream::inst;
      res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_c8;
      local_a0 = &local_170;
      local_98.m_file_name.m_end =
           (iterator)((ulong)local_98.m_file_name.m_end & 0xffffffffffffff00);
      local_98.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_0138ec70;
      local_98.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
      local_80 = (assertion_result *)&local_a0;
      pvVar8 = (iterator)0x1;
      pvVar9 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_168,(lazy_ostream *)&local_e8,1,2,REQUIRE,0xf571fb,
                 (size_t)&local_b8,0x8b,&res,"CoinsCacheSizeState::OK",&local_98);
      boost::detail::shared_count::~shared_count((shared_count *)&local_168.m_line_num);
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
    local_328 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_320 = "";
    local_338 = &boost::unit_test::basic_cstring<char_const>::null;
    local_330 = &boost::unit_test::basic_cstring<char_const>::null;
    file_11.m_end = (iterator)0x92;
    file_11.m_begin = (iterator)&local_328;
    msg_11.m_end = pvVar9;
    msg_11.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_338,
               msg_11);
    local_e8.m_file_name.m_end = (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
    local_e8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_01388f08;
    local_e8.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
    local_d0 = (float *)0xf4aea1;
    usage_percentage = (float)Chainstate::GetCoinsCacheSizeState(this_00,0x40200,0);
    local_170._0_4_ = 2;
    local_168.m_file_name.m_begin =
         (iterator)CONCAT71(local_168.m_file_name.m_begin._1_7_,usage_percentage == 2.8026e-45);
    local_168.m_file_name.m_end = (iterator)0x0;
    local_168.m_line_num = 0;
    local_b8._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_b8.m_message.px = (element_type *)0xf56fae;
    local_c8.super_test_observer._vptr_test_observer = (test_observer)&usage_percentage;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0138ec70;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_c8;
    local_a0 = &local_170;
    local_98.m_file_name.m_end = (iterator)((ulong)local_98.m_file_name.m_end & 0xffffffffffffff00);
    local_98.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_0138ec70;
    local_98.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
    local_80 = (assertion_result *)&local_a0;
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_168,(lazy_ostream *)&local_e8,1,2,REQUIRE,0xf57057,
               (size_t)&local_b8,0x92,&res,"CoinsCacheSizeState::CRITICAL",&local_98);
    boost::detail::shared_count::~shared_count((shared_count *)&local_168.m_line_num);
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    output.m_size = 0x20;
    output.m_data = (byte *)&res;
    FastRandomContext::fillrand(rng,output);
    CCoinsViewCache::SetBestBlock(this_01,(uint256 *)&res);
    local_348 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_340 = "";
    local_358 = &boost::unit_test::basic_cstring<char_const>::null;
    local_350 = &boost::unit_test::basic_cstring<char_const>::null;
    file_12.m_end = (iterator)0x95;
    file_12.m_begin = (iterator)&local_348;
    msg_12.m_end = pvVar9;
    msg_12.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_358,
               msg_12);
    _cVar12 = 0x778597;
    bVar11 = CCoinsViewCache::Flush(this_01);
    local_98.m_file_name.m_begin = (iterator)CONCAT71(local_98.m_file_name.m_begin._1_7_,bVar11);
    local_98.m_file_name.m_end = (iterator)0x0;
    local_98.m_line_num = 0;
    local_e8.m_file_name.m_begin = "view.Flush()";
    local_e8.m_file_name.m_end = "";
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01389048;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    local_368 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_360 = "";
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x0;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_e8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_98,(lazy_ostream *)&res,1,0,WARN,_cVar12,
               (size_t)&local_368,0x95);
    boost::detail::shared_count::~shared_count((shared_count *)&local_98.m_line_num);
    local_e8.m_file_name.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_e8.m_file_name.m_end = "";
    local_e8.m_line_num = 0x24;
    puVar5 = boost::unit_test::unit_test_log_t::operator<<
                       (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8);
    boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)&local_b8,(log_level)puVar5);
    local_98.m_file_name.m_end = (iterator)((ulong)local_98.m_file_name.m_end & 0xffffffffffffff00);
    local_98.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_01389c38;
    local_98.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
    local_80 = (assertion_result *)0xf5722c;
    local_168.m_file_name.m_begin = (iterator)CCoinsViewCache::DynamicMemoryUsage(this_01);
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0138ec30;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ = &local_98;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_168;
    boost::unit_test::ut_detail::entry_value_collector::operator<<
              ((entry_value_collector *)&local_b8,(lazy_ostream *)&res);
    boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
              ((entry_value_collector *)&local_b8);
    local_378 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_370 = "";
    local_388 = &boost::unit_test::basic_cstring<char_const>::null;
    local_380 = &boost::unit_test::basic_cstring<char_const>::null;
    file_13.m_end = (iterator)0x9a;
    file_13.m_begin = (iterator)&local_378;
    msg_13.m_end = pvVar9;
    msg_13.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_388,
               msg_13);
    local_e8.m_file_name.m_end = (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
    local_e8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_01388f08;
    local_e8.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
    local_d0 = (float *)0xf4aea1;
    CVar2 = Chainstate::GetCoinsCacheSizeState(this_00,0x40200,0);
    _usage_percentage = (uint *)CONCAT44(uStack_ec,CVar2);
    local_170 = (ulong)local_170._4_4_ << 0x20;
    local_168.m_file_name.m_begin =
         (iterator)CONCAT71(local_168.m_file_name.m_begin._1_7_,CVar2 == OK);
    local_168.m_file_name.m_end = (iterator)0x0;
    local_168.m_line_num = 0;
    local_b8._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_b8.m_message.px = (element_type *)0xf56fae;
    local_c8.super_test_observer._vptr_test_observer = (test_observer)&usage_percentage;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0138ec70;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_c8;
    local_a0 = &local_170;
    local_98.m_file_name.m_end = (iterator)((ulong)local_98.m_file_name.m_end & 0xffffffffffffff00);
    local_98.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_0138ec70;
    local_98.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
    local_80 = (assertion_result *)&local_a0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_168,(lazy_ostream *)&local_e8,1,2,REQUIRE,0xf57057,
               (size_t)&local_b8,0x9a,&res,"CoinsCacheSizeState::OK",&local_98);
    boost::detail::shared_count::~shared_count((shared_count *)&local_168.m_line_num);
  }
  else {
    iVar10 = 1000;
    do {
      AddTestCoin(&res,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
                        super_BasicTestingSetup.m_rng,this_01);
      local_138 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
      ;
      local_130 = "";
      local_148 = &boost::unit_test::basic_cstring<char_const>::null;
      local_140 = &boost::unit_test::basic_cstring<char_const>::null;
      file_14.m_end = (iterator)0x36;
      file_14.m_begin = (iterator)&local_138;
      msg_14.m_end = pvVar9;
      msg_14.m_begin = pvVar8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_148,
                 msg_14);
      local_168.m_file_name.m_end =
           (iterator)((ulong)local_168.m_file_name.m_end & 0xffffffffffffff00);
      local_168.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_01388f08;
      local_168.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
      local_150 = "";
      pCVar6 = CCoinsViewCache::AccessCoin(this_01,&res);
      uVar7 = (ulong)(pCVar6->out).scriptPubKey.super_CScriptBase._union.indirect_contents.capacity;
      if ((pCVar6->out).scriptPubKey.super_CScriptBase._size < 0x1d) {
        uVar7 = 0;
      }
      if ((int)uVar7 == 0) {
        local_170 = 0;
      }
      else {
        local_170 = uVar7 + 0x1f & 0x1fffffff0;
      }
      local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)(local_170 == COIN_SIZE);
      local_b8.m_message.px = (element_type *)0x0;
      local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_c8.super_test_observer._vptr_test_observer = (test_observer)(_func_int **)0xf56f3f;
      local_c0 = "";
      local_a0 = &local_170;
      local_98.m_file_name.m_end =
           (iterator)((ulong)local_98.m_file_name.m_end & 0xffffffffffffff00);
      local_98.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_01388f48;
      local_98.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
      local_80 = (assertion_result *)&local_a0;
      _usage_percentage = &COIN_SIZE;
      local_e8.m_file_name.m_end =
           (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
      local_e8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_01388f88;
      local_e8.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
      local_d0 = &usage_percentage;
      pvVar8 = (iterator)0x1;
      pvVar9 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                (&local_b8,(lazy_ostream *)&local_168,1,2,REQUIRE,0xf57023,(size_t)&local_c8,0x36,
                 &local_98,"COIN_SIZE",&local_e8);
      boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
    local_180 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_178 = "";
    local_190 = &boost::unit_test::basic_cstring<char_const>::null;
    local_188 = &boost::unit_test::basic_cstring<char_const>::null;
    file_15.m_end = (iterator)0x3b;
    file_15.m_begin = (iterator)&local_180;
    msg_15.m_end = pvVar9;
    msg_15.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_190,
               msg_15);
    local_e8.m_file_name.m_end = (iterator)((ulong)local_e8.m_file_name.m_end & 0xffffffffffffff00);
    local_e8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_01388f08;
    local_e8.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
    local_d0 = (float *)0xf4aea1;
    CVar2 = Chainstate::GetCoinsCacheSizeState(this_00,0x40200,0);
    _usage_percentage = (uint *)CONCAT44(uStack_ec,CVar2);
    local_170 = CONCAT44(local_170._4_4_,2);
    local_168.m_file_name.m_begin =
         (iterator)CONCAT71(local_168.m_file_name.m_begin._1_7_,CVar2 == CRITICAL);
    local_168.m_file_name.m_end = (iterator)0x0;
    local_168.m_line_num = 0;
    local_b8._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_b8.m_message.px = (element_type *)0xf56fae;
    local_c8.super_test_observer._vptr_test_observer = (test_observer)&usage_percentage;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0138ec70;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_c8;
    local_a0 = &local_170;
    local_98.m_file_name.m_end = (iterator)((ulong)local_98.m_file_name.m_end & 0xffffffffffffff00);
    local_98.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_0138ec70;
    local_98.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
    local_80 = (assertion_result *)&local_a0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_168,(lazy_ostream *)&local_e8,1,2,REQUIRE,0xf57057,
               (size_t)&local_b8,0x3b,&res,"CoinsCacheSizeState::CRITICAL",&local_98);
    boost::detail::shared_count::~shared_count((shared_count *)&local_168.m_line_num);
    local_98.m_file_name.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_98.m_file_name.m_end = "";
    local_98.m_line_num = 0x3d;
    puVar5 = boost::unit_test::unit_test_log_t::operator<<
                       (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_98);
    boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)&local_e8,(log_level)puVar5);
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0138ecb0;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = anon_var_dwarf_1e89304;
    boost::unit_test::ut_detail::entry_value_collector::operator<<
              ((entry_value_collector *)&local_e8,(lazy_ostream *)&res);
    boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
              ((entry_value_collector *)&local_e8);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock11.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(getcoinscachesizestate)
{
    Chainstate& chainstate{m_node.chainman->ActiveChainstate()};

    constexpr bool is_64_bit = sizeof(void*) == 8;

    LOCK(::cs_main);
    auto& view = chainstate.CoinsTip();

    // The number of bytes consumed by coin's heap data, i.e. CScript
    // (prevector<28, unsigned char>) when assigned 56 bytes of data per above.
    //
    // See also: Coin::DynamicMemoryUsage().
    constexpr unsigned int COIN_SIZE = is_64_bit ? 80 : 64;

    auto print_view_mem_usage = [](CCoinsViewCache& view) {
        BOOST_TEST_MESSAGE("CCoinsViewCache memory usage: " << view.DynamicMemoryUsage());
    };

    // PoolResource defaults to 256 KiB that will be allocated, so we'll take that and make it a bit larger.
    constexpr size_t MAX_COINS_CACHE_BYTES = 262144 + 512;

    // Without any coins in the cache, we shouldn't need to flush.
    BOOST_TEST(
        chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, /*max_mempool_size_bytes=*/ 0) != CoinsCacheSizeState::CRITICAL);

    // If the initial memory allocations of cacheCoins don't match these common
    // cases, we can't really continue to make assertions about memory usage.
    // End the test early.
    if (view.DynamicMemoryUsage() != 32 && view.DynamicMemoryUsage() != 16) {
        // Add a bunch of coins to see that we at least flip over to CRITICAL.

        for (int i{0}; i < 1000; ++i) {
            const COutPoint res = AddTestCoin(m_rng, view);
            BOOST_CHECK_EQUAL(view.AccessCoin(res).DynamicMemoryUsage(), COIN_SIZE);
        }

        BOOST_CHECK_EQUAL(
            chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, /*max_mempool_size_bytes=*/0),
            CoinsCacheSizeState::CRITICAL);

        BOOST_TEST_MESSAGE("Exiting cache flush tests early due to unsupported arch");
        return;
    }

    print_view_mem_usage(view);
    BOOST_CHECK_EQUAL(view.DynamicMemoryUsage(), is_64_bit ? 32U : 16U);

    // We should be able to add COINS_UNTIL_CRITICAL coins to the cache before going CRITICAL.
    // This is contingent not only on the dynamic memory usage of the Coins
    // that we're adding (COIN_SIZE bytes per), but also on how much memory the
    // cacheCoins (unordered_map) preallocates.
    constexpr int COINS_UNTIL_CRITICAL{3};

    // no coin added, so we have plenty of space left.
    BOOST_CHECK_EQUAL(
        chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, /*max_mempool_size_bytes*/ 0),
        CoinsCacheSizeState::OK);

    for (int i{0}; i < COINS_UNTIL_CRITICAL; ++i) {
        const COutPoint res = AddTestCoin(m_rng, view);
        print_view_mem_usage(view);
        BOOST_CHECK_EQUAL(view.AccessCoin(res).DynamicMemoryUsage(), COIN_SIZE);

        // adding first coin causes the MemoryResource to allocate one 256 KiB chunk of memory,
        // pushing us immediately over to LARGE
        BOOST_CHECK_EQUAL(
            chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, /*max_mempool_size_bytes=*/ 0),
            CoinsCacheSizeState::LARGE);
    }

    // Adding some additional coins will push us over the edge to CRITICAL.
    for (int i{0}; i < 4; ++i) {
        AddTestCoin(m_rng, view);
        print_view_mem_usage(view);
        if (chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, /*max_mempool_size_bytes=*/0) ==
            CoinsCacheSizeState::CRITICAL) {
            break;
        }
    }

    BOOST_CHECK_EQUAL(
        chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, /*max_mempool_size_bytes=*/0),
        CoinsCacheSizeState::CRITICAL);

    // Passing non-zero max mempool usage (512 KiB) should allow us more headroom.
    BOOST_CHECK_EQUAL(
        chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, /*max_mempool_size_bytes=*/ 1 << 19),
        CoinsCacheSizeState::OK);

    for (int i{0}; i < 3; ++i) {
        AddTestCoin(m_rng, view);
        print_view_mem_usage(view);
        BOOST_CHECK_EQUAL(
            chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, /*max_mempool_size_bytes=*/ 1 << 19),
            CoinsCacheSizeState::OK);
    }

    // Adding another coin with the additional mempool room will put us >90%
    // but not yet critical.
    AddTestCoin(m_rng, view);
    print_view_mem_usage(view);

    // Only perform these checks on 64 bit hosts; I haven't done the math for 32.
    if (is_64_bit) {
        float usage_percentage = (float)view.DynamicMemoryUsage() / (MAX_COINS_CACHE_BYTES + (1 << 10));
        BOOST_TEST_MESSAGE("CoinsTip usage percentage: " << usage_percentage);
        BOOST_CHECK(usage_percentage >= 0.9);
        BOOST_CHECK(usage_percentage < 1);
        BOOST_CHECK_EQUAL(
            chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, /*max_mempool_size_bytes*/ 1 << 10), // 1024
            CoinsCacheSizeState::LARGE);
    }

    // Using the default max_* values permits way more coins to be added.
    for (int i{0}; i < 1000; ++i) {
        AddTestCoin(m_rng, view);
        BOOST_CHECK_EQUAL(
            chainstate.GetCoinsCacheSizeState(),
            CoinsCacheSizeState::OK);
    }

    // Flushing the view does take us back to OK because ReallocateCache() is called

    BOOST_CHECK_EQUAL(
        chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, 0),
        CoinsCacheSizeState::CRITICAL);

    view.SetBestBlock(m_rng.rand256());
    BOOST_CHECK(view.Flush());
    print_view_mem_usage(view);

    BOOST_CHECK_EQUAL(
        chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, 0),
        CoinsCacheSizeState::OK);
}